

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O1

SRes LzmaDec_AllocateProbs(CLzmaDec *p,Byte *props,uint propsSize,ISzAlloc *alloc)

{
  SRes SVar1;
  CLzmaProps propNew;
  CLzmaProps local_28;
  
  SVar1 = LzmaProps_Decode(&local_28,props,propsSize);
  if ((SVar1 == 0) && (SVar1 = LzmaDec_AllocateProbs2(p,&local_28,alloc), SVar1 == 0)) {
    (p->prop).lc = local_28.lc;
    (p->prop).lp = local_28.lp;
    (p->prop).pb = local_28.pb;
    (p->prop).dicSize = local_28.dicSize;
    SVar1 = 0;
  }
  return SVar1;
}

Assistant:

SRes LzmaDec_AllocateProbs(CLzmaDec *p, const Byte *props, unsigned propsSize, ISzAlloc *alloc)
{
  CLzmaProps propNew;
  RINOK(LzmaProps_Decode(&propNew, props, propsSize));
  RINOK(LzmaDec_AllocateProbs2(p, &propNew, alloc));
  p->prop = propNew;
  return SZ_OK;
}